

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_aggregate.cpp
# Opt level: O2

vector<unsigned_long,_true> * __thiscall
duckdb::LogicalAggregate::GetTableIndex
          (vector<unsigned_long,_true> *__return_storage_ptr__,LogicalAggregate *this)

{
  initializer_list<unsigned_long> __l;
  allocator_type local_29;
  idx_t local_28;
  idx_t iStack_20;
  
  local_28 = this->group_index;
  iStack_20 = this->aggregate_index;
  __l._M_len = 2;
  __l._M_array = &local_28;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
             __l,&local_29);
  if (this->groupings_index != 0xffffffffffffffff) {
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
               &this->groupings_index);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<idx_t> LogicalAggregate::GetTableIndex() const {
	vector<idx_t> result {group_index, aggregate_index};
	if (groupings_index != DConstants::INVALID_INDEX) {
		result.push_back(groupings_index);
	}
	return result;
}